

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O1

void __thiscall QListWidgetItem::~QListWidgetItem(QListWidgetItem *this)

{
  QListWidgetItemPrivate *pQVar1;
  QListModel *this_00;
  
  this->_vptr_QListWidgetItem = (_func_int **)&PTR__QListWidgetItem_0081c3e0;
  this_00 = listModel(this);
  if (this_00 != (QListModel *)0x0) {
    QListModel::remove(this_00,(char *)this);
  }
  pQVar1 = this->d;
  if (pQVar1 != (QListWidgetItemPrivate *)0x0) {
    QArrayDataPointer<QWidgetItemData>::~QArrayDataPointer(&(pQVar1->values).d);
    operator_delete(pQVar1,0x28);
    return;
  }
  return;
}

Assistant:

QListWidgetItem::~QListWidgetItem()
{
    if (QListModel *model = listModel())
        model->remove(this);
    delete d;
}